

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMS_TAGGED_POLICY_Marshal(TPMS_TAGGED_POLICY *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  
  UINT32_Marshal(&source->handle,buffer,size);
  UVar1 = TPMT_HA_Marshal(&source->policyHash,buffer,size);
  return UVar1 + 4;
}

Assistant:

UINT16
TPMS_TAGGED_POLICY_Marshal(TPMS_TAGGED_POLICY *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPM_HANDLE_Marshal((TPM_HANDLE *)&(source->handle), buffer, size));
    result = (UINT16)(result + TPMT_HA_Marshal((TPMT_HA *)&(source->policyHash), buffer, size));
    return result;
}